

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O3

sexp_conflict
sexp_listen(sexp_conflict ctx,sexp_conflict self,sexp_conflict fileno,sexp_conflict backlog)

{
  int __fd;
  int iVar1;
  uint uVar2;
  sexp_conflict psVar3;
  
  if ((((ulong)fileno & 3) == 0) && (fileno->tag == 0x12)) {
    if (((ulong)backlog & 1) == 0) {
      psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,2);
      return psVar3;
    }
    __fd = (fileno->value).promise.donep;
    iVar1 = listen(__fd,(int)((ulong)backlog >> 1));
    if (-1 < iVar1) {
      uVar2 = fcntl(__fd,3);
      fcntl(__fd,4,(ulong)(uVar2 | 0x800));
    }
    return (sexp_conflict)((ulong)(iVar1 == 0) << 8 | 0x3e);
  }
  psVar3 = (sexp_conflict)sexp_type_exception(ctx,self,0x12,fileno);
  return psVar3;
}

Assistant:

sexp sexp_listen (sexp ctx, sexp self, sexp fileno, sexp backlog) {
  int fd, res;
  sexp_assert_type(ctx, sexp_filenop, SEXP_FILENO, fileno);
  sexp_assert_type(ctx, sexp_fixnump, SEXP_FIXNUM, backlog);
  fd = sexp_fileno_fd(fileno);
  res = listen(fd, sexp_unbox_fixnum(backlog));
#if SEXP_USE_GREEN_THREADS
  if (res >= 0)
    fcntl(fd, F_SETFL, fcntl(fd, F_GETFL) | O_NONBLOCK);
#endif
  return (res == 0) ? SEXP_TRUE : SEXP_FALSE;
}